

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O1

string * __thiscall
GMAA_MAAstarCluster::SoftPrintClusteringStats_abi_cxx11_
          (string *__return_storage_ptr__,GMAA_MAAstarCluster *this)

{
  int *piVar1;
  MultiAgentDecisionProcessDiscreteInterface *pMVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  string *psVar8;
  int iVar9;
  pointer pvVar10;
  long lVar11;
  undefined4 extraout_var;
  undefined8 uVar12;
  ostream *poVar13;
  int *piVar14;
  LIndex i;
  Index aI;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  stringstream ss;
  stringstream ss_1;
  long *local_518;
  long local_510;
  long local_508 [2];
  long *local_4f8;
  long local_4f0;
  long local_4e8 [2];
  string *local_4d8;
  ios_base *local_4d0;
  stringstream local_4c8 [16];
  long local_4b8 [14];
  ios_base local_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,"Number of joint types after clustering in each BG.",0x32);
  cVar7 = (char)(ostream *)local_4b8;
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b8,
             "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>",
             0x54);
  std::ios::widen((char)*(undefined8 *)(local_4b8[0] + -0x18) + cVar7);
  std::ostream::put(cVar7);
  std::ostream::flush();
  pvVar10 = (this->_m_clusteredBGsizes).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_4d8 = __return_storage_ptr__;
  if ((this->_m_clusteredBGsizes).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar10) {
    local_4d0 = aiStack_2c0;
    uVar16 = 0;
    do {
      piVar14 = pvVar10[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar1 = pvVar10[uVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar11 = (long)piVar1 - (long)piVar14;
      if (lVar11 != 0) {
        dVar17 = 0.0;
        do {
          dVar17 = dVar17 + (double)*piVar14;
          piVar14 = piVar14 + 1;
        } while (piVar14 != piVar1);
        auVar3._8_8_ = in_XMM2_Qb;
        auVar3._0_8_ = in_XMM2_Qa;
        auVar3 = vcvtusi2sd_avx512f(auVar3,lVar11 >> 2);
        dVar17 = dVar17 / auVar3._0_8_;
        auVar4._8_8_ = in_XMM2_Qb;
        auVar4._0_8_ = in_XMM2_Qa;
        auVar3 = vcvtusi2sd_avx512f(auVar4,(int)uVar16);
        uVar15 = 0;
        i = 1;
        while( true ) {
          iVar9 = (*(this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                    super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
                    super_PlanningUnit._vptr_PlanningUnit[6])(this);
          if (CONCAT44(extraout_var,iVar9) == uVar15) break;
          pMVar2 = (this->super_GeneralizedMAAStarPlannerForDecPOMDPDiscrete).
                   super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete._m_madp;
          uVar12 = (**(code **)((long)*pMVar2 + 0xc0))(pMVar2,uVar15);
          auVar5._8_8_ = in_XMM2_Qb;
          auVar5._0_8_ = in_XMM2_Qa;
          auVar4 = vcvtusi2sd_avx512f(auVar5,uVar12);
          dVar18 = pow(auVar4._0_8_,auVar3._0_8_);
          auVar6._8_8_ = in_XMM2_Qb;
          auVar6._0_8_ = in_XMM2_Qa;
          auVar4 = vcvtusi2sd_avx512f(auVar6,i);
          auVar19._8_8_ = 0;
          auVar19._0_8_ = dVar18 * auVar4._0_8_;
          i = vcvttsd2usi_avx512f(auVar19);
          uVar15 = (ulong)((int)uVar15 + 1);
        }
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        dVar18 = Globals::CastLIndexToDouble(i);
        poVar13 = std::ostream::_M_insert<double>(dVar18 / dVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        poVar13 = std::ostream::_M_insert<double>(dVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        poVar13 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
        pvVar10 = (this->_m_clusteredBGsizes).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar16;
        std::__cxx11::stringstream::stringstream(local_340);
        piVar14 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar1 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
        for (; piVar14 != piVar1; piVar14 = piVar14 + 1) {
          if (piVar14 !=
              (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
          }
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::ostream::operator<<(local_1a8,*piVar14);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base(local_138);
          std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_4f8,local_4f0);
          if (local_4f8 != local_4e8) {
            operator_delete(local_4f8,local_4e8[0] + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream(local_340);
        std::ios_base::~ios_base(local_4d0);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,(char *)local_518,local_510);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        if (local_518 != local_508) {
          operator_delete(local_518,local_508[0] + 1);
        }
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      pvVar10 = (this->_m_clusteredBGsizes).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (((long)(this->_m_clusteredBGsizes).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) *
             -0x5555555555555555 - uVar16 != 0);
  }
  psVar8 = local_4d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(local_448);
  return psVar8;
}

Assistant:

std::string GMAA_MAAstarCluster::SoftPrintClusteringStats() const
{
    stringstream ss;

    ss << "Number of joint types after clustering in each BG." << endl;
    ss << "timestep compressionRatio averageAfterClustering sizeWithoutClustering <all entries>" << endl;

#if 0
    ss << "CBGsize";
    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                  _m_clusteredBGsizes[i].end(),0.0) /
            _m_clusteredBGsizes[i].size();
        if(_m_clusteredBGsizes[i].size()>0)
            ss << " " << average;
    }
    ss << endl;

    ss << "CBGratio";
#endif

    for(unsigned int i=0;i!=_m_clusteredBGsizes.size();++i)
    {
        if(_m_clusteredBGsizes[i].size()>0)
        {
            double average=accumulate(_m_clusteredBGsizes[i].begin(),
                                      _m_clusteredBGsizes[i].end(),0.0) /
                _m_clusteredBGsizes[i].size();

            LIndex originalBGsize=1;
            for(Index aI=0;aI!=GetNrAgents();++aI)
                originalBGsize*=pow(//pow needs correct arguments, otherwise I get 
                    //call of overloaded 'pow(size_t, unsigned int&)' is ambiguous
                    ((double)GetNrObservations(aI)),
                    ((double)i));
            
#if 1
            ss << i
               << " " << CastLIndexToDouble(originalBGsize)/average
               << " " << average
               << " " << originalBGsize
               << " " << SoftPrintVector(_m_clusteredBGsizes[i]) << endl;
#else
            ss << " " << static_cast<double>(originalBGsize)/average;
#endif
        }
    }
    return(ss.str());
}